

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgsrfs.c
# Opt level: O3

void cgsrfs(trans_t trans,SuperMatrix *A,SuperMatrix *L,SuperMatrix *U,int *perm_c,int *perm_r,
           char *equed,float *R,float *C,SuperMatrix *B,SuperMatrix *X,float *ferr,float *berr,
           SuperLUStat_t *stat,int *info)

{
  float *est;
  char cVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  int *piVar5;
  bool bVar6;
  double dVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  singlecomplex *psVar13;
  void *addr;
  long lVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  singlecomplex *psVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  singlecomplex *psVar22;
  bool bVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  double dVar27;
  int local_264;
  undefined8 local_260;
  byte local_252;
  char transc [1];
  trans_t local_220;
  uint local_21c;
  int kase;
  int nrow;
  int ione;
  ulong local_208;
  singlecomplex *local_200;
  int *local_1f8;
  ulong local_1f0;
  long local_1e8;
  float local_1dc;
  singlecomplex *local_1d8;
  long local_1d0;
  long local_1c8;
  SuperMatrix *local_1c0;
  SuperMatrix *local_1b8;
  int *local_1b0;
  int *local_1a8;
  double local_1a0;
  long local_198;
  singlecomplex *local_190;
  singlecomplex *local_188;
  singlecomplex done;
  SuperMatrix local_178;
  long local_158;
  long local_150;
  long local_148;
  singlecomplex *local_140;
  int isave [3];
  
  ione = 1;
  nrow = A->nrow;
  done.r = 1.0;
  done.i = 0.0;
  pvVar4 = A->Store;
  lVar14 = *(long *)((long)pvVar4 + 8);
  psVar13 = *(singlecomplex **)((long)B->Store + 8);
  local_188 = *(singlecomplex **)((long)X->Store + 8);
  iVar11 = *B->Store;
  iVar17 = *X->Store;
  lVar12 = (long)iVar17;
  uVar2 = B->ncol;
  uVar19 = (ulong)uVar2;
  *info = 0;
  local_1c0 = U;
  local_1b8 = L;
  if (CONJ < trans) {
    iVar10 = 1;
    iVar15 = -1;
LAB_001047e6:
    *info = iVar15;
    local_264 = iVar10;
    input_error("cgsrfs",&local_264);
    return;
  }
  uVar3 = A->nrow;
  iVar10 = 2;
  iVar15 = -2;
  local_198 = lVar12;
  local_190 = psVar13;
  if (((((int)uVar3 < 0) || (uVar3 != A->ncol)) || (A->Stype != SLU_NC)) ||
     ((A->Dtype != SLU_C || (A->Mtype != SLU_GE)))) goto LAB_001047e6;
  iVar10 = 3;
  iVar15 = -3;
  local_1c8 = lVar14;
  if ((((L->nrow < 0) || ((L->nrow != L->ncol || (L->Stype != SLU_SC)))) || (L->Dtype != SLU_C)) ||
     (L->Mtype != SLU_TRLU)) goto LAB_001047e6;
  iVar10 = 4;
  iVar15 = -4;
  if ((((U->nrow < 0) || (U->nrow != U->ncol)) || (U->Stype != SLU_NC)) ||
     ((U->Dtype != SLU_C || (U->Mtype != SLU_TRU)))) goto LAB_001047e6;
  iVar10 = 10;
  iVar15 = -10;
  local_1f0 = uVar19;
  local_1b0 = perm_c;
  local_1a8 = perm_r;
  if (((iVar11 < (int)uVar3) || ((B->Stype != SLU_DN || (B->Dtype != SLU_C)))) ||
     (B->Mtype != SLU_GE)) goto LAB_001047e6;
  iVar10 = 0xb;
  iVar15 = -0xb;
  if ((((iVar17 < (int)uVar3) || (X->Stype != SLU_DN)) || (X->Dtype != SLU_C)) ||
     (X->Mtype != SLU_GE)) goto LAB_001047e6;
  if (uVar2 == 0 || (ulong)uVar3 == 0) {
    if ((int)uVar2 < 1) {
      return;
    }
    uVar16 = 0;
    do {
      ferr[uVar16] = 0.0;
      berr[uVar16] = 0.0;
      uVar16 = uVar16 + 1;
    } while (uVar19 != uVar16);
    return;
  }
  cVar1 = *equed;
  bVar23 = true;
  if (cVar1 != 'R') {
    bVar23 = cVar1 == 'B';
    local_260 = (double)CONCAT71(local_260._1_7_,1);
    if (cVar1 == 'C') goto LAB_00104981;
  }
  local_260 = (double)CONCAT71(local_260._1_7_,cVar1 == 'B');
LAB_00104981:
  psVar13 = singlecomplexMalloc((ulong)uVar3 * 2);
  addr = superlu_malloc((long)A->nrow << 2);
  local_1f8 = int32Malloc(A->nrow);
  if ((addr == (void *)0x0 || psVar13 == (singlecomplex *)0x0) || local_1f8 == (int *)0x0) {
    sprintf((char *)isave,"%s at line %d in file %s\n","Malloc fails for work/rwork/iwork.",0xe3,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cgsrfs.c");
    superlu_abort_and_exit((char *)isave);
  }
  if (trans == NOTRANS) {
    transc[0] = 'N';
    local_220 = TRANS;
  }
  else {
    if (trans == TRANS) {
      transc[0] = 'T';
    }
    else {
      transc[0] = 'C';
    }
    local_220 = NOTRANS;
  }
  iVar17 = A->ncol;
  fVar24 = smach("Epsilon");
  fVar25 = smach("Safe minimum");
  if (0 < A->nrow) {
    lVar14 = 0;
    do {
      local_1f8[lVar14] = 0;
      lVar14 = lVar14 + 1;
      local_264 = (int)lVar14;
    } while (local_264 < A->nrow);
  }
  iVar10 = A->ncol;
  if (trans == NOTRANS) {
    if (0 < iVar10) {
      piVar5 = *(int **)((long)pvVar4 + 0x18);
      iVar15 = *piVar5;
      lVar14 = 0;
      do {
        lVar12 = lVar14 + 1;
        lVar14 = lVar14 + 1;
        iVar9 = piVar5[lVar12];
        if (iVar15 < piVar5[lVar12]) {
          lVar12 = *(long *)((long)pvVar4 + 0x10);
          lVar20 = (long)iVar15;
          do {
            local_1f8[*(int *)(lVar12 + lVar20 * 4)] = local_1f8[*(int *)(lVar12 + lVar20 * 4)] + 1;
            lVar20 = lVar20 + 1;
            local_264 = (int)lVar20;
          } while (local_264 < piVar5[lVar14]);
          iVar10 = A->ncol;
          iVar9 = piVar5[lVar14];
        }
        iVar15 = iVar9;
      } while (lVar14 < iVar10);
    }
  }
  else if (0 < iVar10) {
    lVar12 = *(long *)((long)pvVar4 + 0x18);
    lVar14 = 0;
    do {
      local_1f8[lVar14] = *(int *)(lVar12 + 4 + lVar14 * 4) - *(int *)(lVar12 + lVar14 * 4);
      lVar14 = lVar14 + 1;
    } while (lVar14 < A->ncol);
  }
  local_178.Stype = B->Stype;
  local_178.Dtype = B->Dtype;
  local_178.Mtype = B->Mtype;
  local_178.nrow = B->nrow;
  local_178.ncol = 1;
  local_178.Store = superlu_malloc(0x10);
  if ((int *)local_178.Store == (int *)0x0) {
    sprintf((char *)isave,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for Bjcol.Store",0x10c,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cgsrfs.c");
    superlu_abort_and_exit((char *)isave);
  }
  *(int *)local_178.Store = iVar11;
  *(singlecomplex **)((long)local_178.Store + 8) = psVar13;
  if ((int)local_1f0 < 1) {
LAB_001057c7:
    superlu_free(psVar13);
    superlu_free(addr);
    superlu_free(local_1f8);
    superlu_free(local_178.Store);
    return;
  }
  fVar25 = fVar25 * (float)(iVar17 + 1);
  local_148 = (long)iVar11;
  local_1a0 = (double)fVar25;
  fVar25 = fVar25 / fVar24;
  local_252 = trans == NOTRANS & (byte)local_260;
  bVar23 = (bool)(bVar23 & trans != NOTRANS);
  local_150 = local_148 * 8;
  local_158 = local_198 * 8;
  local_208 = 0;
  local_200 = local_188;
  local_1d8 = local_190;
LAB_00104c1b:
  local_140 = local_190 + local_208 * local_148;
  psVar22 = local_188 + local_208 * local_198;
  local_1dc = 3.0;
  local_21c = 0;
  do {
    ccopy_(&nrow,local_140,&ione,psVar13,&ione);
    sp_cgemv(transc,(singlecomplex)0xbf800000,A,psVar22,ione,done,psVar13,ione);
    local_264 = 0;
    if (0 < A->nrow) {
      lVar14 = 0;
      psVar18 = local_1d8;
      do {
        dVar27 = c_abs1(psVar18);
        *(float *)((long)addr + lVar14 * 4) = (float)dVar27;
        lVar14 = lVar14 + 1;
        local_264 = (int)lVar14;
        psVar18 = psVar18 + 1;
      } while (local_264 < A->nrow);
    }
    iVar11 = A->ncol;
    if (trans == NOTRANS) {
      if (0 < iVar11) {
        lVar14 = 0;
        do {
          dVar27 = c_abs1(psVar22 + lVar14);
          iVar11 = *(int *)(*(long *)((long)pvVar4 + 0x18) + lVar14 * 4);
          lVar20 = (long)iVar11;
          lVar12 = lVar14 + 1;
          if (iVar11 < *(int *)(*(long *)((long)pvVar4 + 0x18) + 4 + lVar14 * 4)) {
            local_260 = (double)(float)dVar27;
            psVar18 = (singlecomplex *)(local_1c8 + lVar20 * 8);
            do {
              dVar27 = c_abs1(psVar18);
              lVar14 = (long)*(int *)(*(long *)((long)pvVar4 + 0x10) + lVar20 * 4);
              *(float *)((long)addr + lVar14 * 4) =
                   (float)(dVar27 * local_260 + (double)*(float *)((long)addr + lVar14 * 4));
              lVar20 = lVar20 + 1;
              psVar18 = psVar18 + 1;
            } while ((int)lVar20 < *(int *)(*(long *)((long)pvVar4 + 0x18) + lVar12 * 4));
          }
          lVar14 = lVar12;
        } while (lVar12 < A->ncol);
      }
    }
    else if (0 < iVar11) {
      lVar14 = *(long *)((long)pvVar4 + 0x18);
      lVar12 = 0;
      do {
        local_264 = *(int *)(lVar14 + lVar12 * 4);
        lVar21 = (long)local_264;
        fVar26 = 0.0;
        lVar20 = lVar12;
        lVar8 = lVar12 + 1;
        if (local_264 < *(int *)(lVar14 + 4 + lVar12 * 4)) {
          psVar18 = (singlecomplex *)(local_1c8 + lVar21 * 8);
          local_1e8 = lVar12 + 1;
          local_1d0 = lVar12;
          do {
            local_260 = (double)CONCAT44(local_260._4_4_,fVar26);
            iVar11 = *(int *)(*(long *)((long)pvVar4 + 0x10) + lVar21 * 4);
            dVar27 = c_abs1(psVar18);
            dVar7 = c_abs1(psVar22 + iVar11);
            fVar26 = (float)(dVar7 * dVar27 + (double)(float)local_260);
            lVar21 = lVar21 + 1;
            local_264 = (int)lVar21;
            lVar14 = *(long *)((long)pvVar4 + 0x18);
            psVar18 = psVar18 + 1;
          } while (local_264 < *(int *)(lVar14 + local_1e8 * 4));
          iVar11 = A->ncol;
          lVar20 = local_1d0;
          lVar8 = local_1e8;
        }
        lVar12 = lVar8;
        *(float *)((long)addr + lVar20 * 4) = fVar26 + *(float *)((long)addr + lVar20 * 4);
      } while (lVar12 < iVar11);
    }
    local_264 = 0;
    if (A->nrow < 1) {
      local_260 = (double)((ulong)local_260._4_4_ << 0x20);
      bVar6 = false;
    }
    else {
      local_260 = (double)((ulong)local_260._4_4_ << 0x20);
      lVar14 = 0;
      psVar18 = psVar13;
      do {
        fVar26 = *(float *)((long)addr + lVar14 * 4);
        if (fVar26 <= fVar25) {
          if (((fVar26 != 0.0) || (NAN(fVar26))) &&
             (dVar27 = (double)(float)local_260, dVar7 = c_abs1(psVar18),
             dVar27 <= (dVar7 + local_1a0) / (double)*(float *)((long)addr + lVar14 * 4))) {
            dVar27 = c_abs1(psVar18);
            dVar27 = dVar27 + local_1a0;
            goto LAB_00104f5f;
          }
        }
        else {
          dVar27 = (double)(float)local_260;
          dVar7 = c_abs1(psVar18);
          if (dVar27 <= dVar7 / (double)*(float *)((long)addr + lVar14 * 4)) {
            dVar27 = c_abs1(psVar18);
LAB_00104f5f:
            local_260 = (double)CONCAT44(local_260._4_4_,
                                         (float)(dVar27 / (double)*(float *)((long)addr + lVar14 * 4
                                                                            )));
          }
        }
        lVar14 = lVar14 + 1;
        local_264 = (int)lVar14;
        psVar18 = psVar18 + 1;
      } while (local_264 < A->nrow);
      bVar6 = 0 < A->nrow;
    }
    berr[local_208] = (float)local_260;
    if ((((float)local_260 <= fVar24) || (local_1dc < (float)local_260 + (float)local_260)) ||
       (4 < local_21c)) break;
    cgstrs(trans,local_1b8,local_1c0,local_1b0,local_1a8,&local_178,stat,info);
    caxpy_(&nrow,&done,psVar13,&ione,psVar22,&ione);
    local_1dc = berr[local_208];
    local_21c = local_21c + 1;
  } while( true );
  stat->RefineSteps = local_21c;
  local_264 = 0;
  if (bVar6) {
    lVar14 = 0;
    psVar18 = local_1d8;
    do {
      dVar27 = c_abs1(psVar18);
      *(float *)((long)addr + lVar14 * 4) = (float)dVar27;
      lVar14 = lVar14 + 1;
      local_264 = (int)lVar14;
      psVar18 = psVar18 + 1;
    } while (local_264 < A->nrow);
  }
  iVar11 = A->ncol;
  if (trans == NOTRANS) {
    if (0 < iVar11) {
      dVar27 = 0.0;
      do {
        dVar7 = c_abs1(psVar22 + (long)dVar27);
        iVar11 = *(int *)(*(long *)((long)pvVar4 + 0x18) + (long)dVar27 * 4);
        lVar14 = (long)iVar11;
        local_260 = (double)((long)dVar27 + 1);
        if (iVar11 < *(int *)(*(long *)((long)pvVar4 + 0x18) + 4 + (long)dVar27 * 4)) {
          psVar18 = (singlecomplex *)(local_1c8 + lVar14 * 8);
          do {
            dVar27 = c_abs1(psVar18);
            lVar12 = (long)*(int *)(*(long *)((long)pvVar4 + 0x10) + lVar14 * 4);
            *(float *)((long)addr + lVar12 * 4) =
                 (float)(dVar27 * (double)(float)dVar7 + (double)*(float *)((long)addr + lVar12 * 4)
                        );
            lVar14 = lVar14 + 1;
            local_264 = (int)lVar14;
            psVar18 = psVar18 + 1;
          } while (local_264 < *(int *)(*(long *)((long)pvVar4 + 0x18) + (long)local_260 * 4));
        }
        dVar27 = local_260;
      } while ((long)local_260 < (long)A->ncol);
    }
  }
  else if (0 < iVar11) {
    lVar14 = *(long *)((long)pvVar4 + 0x18);
    local_1e8 = 0;
    do {
      local_264 = *(int *)(lVar14 + local_1e8 * 4);
      lVar20 = (long)local_264;
      lVar12 = local_1e8 + 1;
      fVar26 = 0.0;
      local_1d0 = lVar12;
      if (local_264 < *(int *)(lVar14 + 4 + local_1e8 * 4)) {
        psVar18 = (singlecomplex *)(local_1c8 + lVar20 * 8);
        local_260 = (double)((ulong)local_260 & 0xffffffff00000000);
        do {
          dVar27 = c_abs1(psVar22 + *(int *)(*(long *)((long)pvVar4 + 0x10) + lVar20 * 4));
          dVar7 = c_abs1(psVar18);
          fVar26 = (float)((double)(float)dVar27 * dVar7 + (double)(float)local_260);
          local_260 = (double)CONCAT44(local_260._4_4_,fVar26);
          lVar20 = lVar20 + 1;
          local_264 = (int)lVar20;
          lVar14 = *(long *)((long)pvVar4 + 0x18);
          psVar18 = psVar18 + 1;
        } while (local_264 < *(int *)(lVar14 + lVar12 * 4));
        iVar11 = A->ncol;
      }
      *(float *)((long)addr + local_1e8 * 4) = fVar26 + *(float *)((long)addr + local_1e8 * 4);
      local_1e8 = local_1d0;
    } while (local_1d0 < iVar11);
  }
  if (0 < A->nrow) {
    lVar14 = 0;
    psVar22 = psVar13;
    do {
      local_260 = (double)CONCAT44(local_260._4_4_,*(undefined4 *)((long)addr + lVar14 * 4));
      dVar27 = c_abs(psVar22);
      dVar27 = (double)((float)(local_1f8[lVar14] + 1) * fVar24 *
                       *(float *)((long)addr + lVar14 * 4)) + dVar27;
      if ((float)local_260 <= fVar25) {
        dVar27 = dVar27 + local_1a0;
      }
      *(float *)((long)addr + lVar14 * 4) = (float)dVar27;
      lVar14 = lVar14 + 1;
      psVar22 = psVar22 + 1;
    } while ((int)lVar14 < A->nrow);
  }
  kase = 0;
  est = ferr + local_208;
  do {
    clacon2_(&nrow,psVar13 + A->nrow,psVar13,est,&kase,isave);
    if (kase == 1) {
      if (local_252 == 0) {
        if ((bVar23) && (iVar11 = A->nrow, 0 < (long)iVar11)) {
          lVar14 = 0;
          do {
            psVar13[lVar14].r = psVar13[lVar14].r * R[lVar14];
            psVar13[lVar14].i = psVar13[lVar14].i * R[lVar14];
            lVar14 = lVar14 + 1;
          } while (iVar11 != lVar14);
        }
      }
      else {
        iVar11 = A->ncol;
        if (0 < (long)iVar11) {
          lVar14 = 0;
          do {
            psVar13[lVar14].r = psVar13[lVar14].r * C[lVar14];
            psVar13[lVar14].i = psVar13[lVar14].i * C[lVar14];
            lVar14 = lVar14 + 1;
          } while (iVar11 != lVar14);
        }
      }
      cgstrs(local_220,local_1b8,local_1c0,local_1b0,local_1a8,&local_178,stat,info);
      local_264 = A->nrow;
      if ((long)local_264 < 1) {
LAB_0010559f:
        local_264 = 0;
      }
      else {
        lVar14 = 0;
        do {
          psVar13[lVar14].r = psVar13[lVar14].r * *(float *)((long)addr + lVar14 * 4);
          psVar13[lVar14].i = psVar13[lVar14].i * *(float *)((long)addr + lVar14 * 4);
          lVar14 = lVar14 + 1;
        } while (local_264 != lVar14);
      }
    }
    else {
      if (kase == 0) break;
      local_264 = A->nrow;
      if ((long)local_264 < 1) {
        local_264 = 0;
      }
      else {
        lVar14 = 0;
        do {
          psVar13[lVar14].r = psVar13[lVar14].r * *(float *)((long)addr + lVar14 * 4);
          psVar13[lVar14].i = psVar13[lVar14].i * *(float *)((long)addr + lVar14 * 4);
          lVar14 = lVar14 + 1;
        } while (local_264 != lVar14);
      }
      cgstrs(trans,local_1b8,local_1c0,local_1b0,local_1a8,&local_178,stat,info);
      if (local_252 == 0) {
        if (bVar23) {
          local_264 = A->ncol;
          if ((long)local_264 < 1) goto LAB_0010559f;
          lVar14 = 0;
          do {
            psVar13[lVar14].r = psVar13[lVar14].r * R[lVar14];
            psVar13[lVar14].i = psVar13[lVar14].i * R[lVar14];
            lVar14 = lVar14 + 1;
          } while (local_264 != lVar14);
        }
      }
      else {
        local_264 = A->ncol;
        if ((long)local_264 < 1) goto LAB_0010559f;
        lVar14 = 0;
        do {
          psVar13[lVar14].r = psVar13[lVar14].r * C[lVar14];
          psVar13[lVar14].i = psVar13[lVar14].i * C[lVar14];
          lVar14 = lVar14 + 1;
        } while (local_264 != lVar14);
      }
    }
  } while (kase != 0);
  local_264 = 0;
  iVar11 = A->nrow;
  if (local_252 == 0) {
    if (bVar23) {
      if (iVar11 < 1) goto LAB_00105785;
      local_260 = (double)((ulong)local_260._4_4_ << 0x20);
      lVar14 = 0;
      psVar22 = local_200;
      do {
        dVar27 = (double)(float)local_260;
        fVar26 = R[lVar14];
        dVar7 = c_abs1(psVar22);
        if (dVar27 <= dVar7 * (double)fVar26) {
          local_260 = (double)R[lVar14];
          dVar27 = c_abs1(psVar22);
          local_260 = (double)CONCAT44(local_260._4_4_,(float)(dVar27 * local_260));
        }
        lVar14 = lVar14 + 1;
        local_264 = (int)lVar14;
        psVar22 = psVar22 + 1;
      } while (local_264 < A->nrow);
    }
    else {
      if (iVar11 < 1) goto LAB_00105785;
      local_260 = (double)((ulong)local_260._4_4_ << 0x20);
      psVar22 = local_200;
      iVar11 = 1;
      do {
        iVar17 = iVar11;
        dVar27 = (double)(float)local_260;
        dVar7 = c_abs1(psVar22);
        if (dVar27 <= dVar7) {
          dVar27 = c_abs1(psVar22);
          local_260 = (double)CONCAT44(local_260._4_4_,(float)dVar27);
        }
        psVar22 = psVar22 + 1;
        iVar11 = iVar17 + 1;
        local_264 = iVar17;
      } while (iVar17 < A->nrow);
    }
  }
  else {
    if (iVar11 < 1) goto LAB_00105785;
    local_260 = (double)((ulong)local_260 & 0xffffffff00000000);
    lVar14 = 0;
    psVar22 = local_200;
    do {
      dVar27 = (double)(float)local_260;
      fVar26 = C[lVar14];
      dVar7 = c_abs1(psVar22);
      if (dVar27 <= dVar7 * (double)fVar26) {
        local_260 = (double)C[lVar14];
        dVar27 = c_abs1(psVar22);
        local_260 = (double)CONCAT44(local_260._4_4_,(float)(dVar27 * local_260));
      }
      lVar14 = lVar14 + 1;
      local_264 = (int)lVar14;
      psVar22 = psVar22 + 1;
    } while (local_264 < A->nrow);
  }
  if (((float)local_260 != 0.0) || (NAN((float)local_260))) {
    *est = *est / (float)local_260;
  }
LAB_00105785:
  local_208 = local_208 + 1;
  local_1d8 = (singlecomplex *)((long)&local_1d8->r + local_150);
  local_200 = (singlecomplex *)((long)&local_200->r + local_158);
  if (local_208 == local_1f0) goto LAB_001057c7;
  goto LAB_00104c1b;
}

Assistant:

void
cgsrfs(trans_t trans, SuperMatrix *A, SuperMatrix *L, SuperMatrix *U,
       int *perm_c, int *perm_r, char *equed, float *R, float *C,
       SuperMatrix *B, SuperMatrix *X, float *ferr, float *berr,
       SuperLUStat_t *stat, int *info)
{


#define ITMAX 5
    
    /* Table of constant values */
    int    ione = 1, nrow = A->nrow;
    singlecomplex ndone = {-1., 0.};
    singlecomplex done = {1., 0.};
    
    /* Local variables */
    NCformat *Astore;
    singlecomplex   *Aval;
    SuperMatrix Bjcol;
    DNformat *Bstore, *Xstore, *Bjcol_store;
    singlecomplex   *Bmat, *Xmat, *Bptr, *Xptr;
    int      kase;
    float   safe1, safe2;
    int      i, j, k, irow, nz, count, notran, rowequ, colequ;
    int      ldb, ldx, nrhs;
    float   s, xk, lstres, eps, safmin;
    char     transc[1];
    trans_t  transt;
    singlecomplex   *work;
    float   *rwork;
    int      *iwork;
    int      isave[3];

    extern int clacon2_(int *, singlecomplex *, singlecomplex *, float *, int *, int []);

    Astore = A->Store;
    Aval   = Astore->nzval;
    Bstore = B->Store;
    Xstore = X->Store;
    Bmat   = Bstore->nzval;
    Xmat   = Xstore->nzval;
    ldb    = Bstore->lda;
    ldx    = Xstore->lda;
    nrhs   = B->ncol;
    
    /* Test the input parameters */
    *info = 0;
    notran = (trans == NOTRANS);
    if ( !notran && trans != TRANS && trans != CONJ ) *info = -1;
    else if ( A->nrow != A->ncol || A->nrow < 0 ||
	      A->Stype != SLU_NC || A->Dtype != SLU_C || A->Mtype != SLU_GE )
	*info = -2;
    else if ( L->nrow != L->ncol || L->nrow < 0 ||
 	      L->Stype != SLU_SC || L->Dtype != SLU_C || L->Mtype != SLU_TRLU )
	*info = -3;
    else if ( U->nrow != U->ncol || U->nrow < 0 ||
 	      U->Stype != SLU_NC || U->Dtype != SLU_C || U->Mtype != SLU_TRU )
	*info = -4;
    else if ( ldb < SUPERLU_MAX(0, A->nrow) ||
 	      B->Stype != SLU_DN || B->Dtype != SLU_C || B->Mtype != SLU_GE )
        *info = -10;
    else if ( ldx < SUPERLU_MAX(0, A->nrow) ||
 	      X->Stype != SLU_DN || X->Dtype != SLU_C || X->Mtype != SLU_GE )
	*info = -11;
    if (*info != 0) {
	i = -(*info);
	input_error("cgsrfs", &i);
	return;
    }

    /* Quick return if possible */
    if ( A->nrow == 0 || nrhs == 0) {
	for (j = 0; j < nrhs; ++j) {
	    ferr[j] = 0.;
	    berr[j] = 0.;
	}
	return;
    }

    rowequ = strncmp(equed, "R", 1)==0 || strncmp(equed, "B", 1)==0;
    colequ = strncmp(equed, "C", 1)==0 || strncmp(equed, "B", 1)==0;
    
    /* Allocate working space */
    work = singlecomplexMalloc(2*A->nrow);
    rwork = (float *) SUPERLU_MALLOC( A->nrow * sizeof(float) );
    iwork = int32Malloc(A->nrow);
    if ( !work || !rwork || !iwork ) 
        ABORT("Malloc fails for work/rwork/iwork.");
    
    if ( notran ) {
	*(unsigned char *)transc = 'N';
        transt = TRANS;
    } else if ( trans == TRANS ) {
	*(unsigned char *)transc = 'T';
	transt = NOTRANS;
    } else if ( trans == CONJ ) {
	*(unsigned char *)transc = 'C';
	transt = NOTRANS;
    }    

    /* NZ = maximum number of nonzero elements in each row of A, plus 1 */
    nz     = A->ncol + 1;
    eps    = smach("Epsilon");
    safmin = smach("Safe minimum");

    /* Set SAFE1 essentially to be the underflow threshold times the
       number of additions in each row. */
    safe1  = nz * safmin;
    safe2  = safe1 / eps;

    /* Compute the number of nonzeros in each row (or column) of A */
    for (i = 0; i < A->nrow; ++i) iwork[i] = 0;
    if ( notran ) {
	for (k = 0; k < A->ncol; ++k)
	    for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i) 
		++iwork[Astore->rowind[i]];
    } else {
	for (k = 0; k < A->ncol; ++k)
	    iwork[k] = Astore->colptr[k+1] - Astore->colptr[k];
    }	

    /* Copy one column of RHS B into Bjcol. */
    Bjcol.Stype = B->Stype;
    Bjcol.Dtype = B->Dtype;
    Bjcol.Mtype = B->Mtype;
    Bjcol.nrow  = B->nrow;
    Bjcol.ncol  = 1;
    Bjcol.Store = (void *) SUPERLU_MALLOC( sizeof(DNformat) );
    if ( !Bjcol.Store ) ABORT("SUPERLU_MALLOC fails for Bjcol.Store");
    Bjcol_store = Bjcol.Store;
    Bjcol_store->lda = ldb;
    Bjcol_store->nzval = work; /* address aliasing */
	
    /* Do for each right hand side ... */
    for (j = 0; j < nrhs; ++j) {
	count = 0;
	lstres = 3.;
	Bptr = &Bmat[j*ldb];
	Xptr = &Xmat[j*ldx];

	while (1) { /* Loop until stopping criterion is satisfied. */

	    /* Compute residual R = B - op(A) * X,   
	       where op(A) = A, A**T, or A**H, depending on TRANS. */
	    
#ifdef _CRAY
	    CCOPY(&nrow, Bptr, &ione, work, &ione);
#else
	    ccopy_(&nrow, Bptr, &ione, work, &ione);
#endif
	    sp_cgemv(transc, ndone, A, Xptr, ione, done, work, ione);

	    /* Compute componentwise relative backward error from formula 
	       max(i) ( abs(R(i)) / ( abs(op(A))*abs(X) + abs(B) )(i) )   
	       where abs(Z) is the componentwise absolute value of the matrix
	       or vector Z.  If the i-th component of the denominator is less
	       than SAFE2, then SAFE1 is added to the i-th component of the   
	       numerator before dividing. */

	    for (i = 0; i < A->nrow; ++i) rwork[i] = c_abs1( &Bptr[i] );
	    
	    /* Compute abs(op(A))*abs(X) + abs(B). */
	    if ( notran ) {
		for (k = 0; k < A->ncol; ++k) {
		    xk = c_abs1( &Xptr[k] );
		    for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i)
			rwork[Astore->rowind[i]] += c_abs1(&Aval[i]) * xk;
		}
	    } else {  /* trans = TRANS or CONJ */
		for (k = 0; k < A->ncol; ++k) {
		    s = 0.;
		    for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i) {
			irow = Astore->rowind[i];
			s += c_abs1(&Aval[i]) * c_abs1(&Xptr[irow]);
		    }
		    rwork[k] += s;
		}
	    }
	    s = 0.;
	    for (i = 0; i < A->nrow; ++i) {
		if (rwork[i] > safe2) {
		    s = SUPERLU_MAX( s, c_abs1(&work[i]) / rwork[i] );
                } else if ( rwork[i] != 0.0 ) {
		    s = SUPERLU_MAX( s, (c_abs1(&work[i]) + safe1) / rwork[i] );
                }
                /* If rwork[i] is exactly 0.0, then we know the true 
                   residual also must be exactly 0.0. */
	    }
	    berr[j] = s;

	    /* Test stopping criterion. Continue iterating if   
	       1) The residual BERR(J) is larger than machine epsilon, and   
	       2) BERR(J) decreased by at least a factor of 2 during the   
	          last iteration, and   
	       3) At most ITMAX iterations tried. */

	    if (berr[j] > eps && berr[j] * 2. <= lstres && count < ITMAX) {
		/* Update solution and try again. */
		cgstrs (trans, L, U, perm_c, perm_r, &Bjcol, stat, info);
		
#ifdef _CRAY
		CAXPY(&nrow, &done, work, &ione,
		       &Xmat[j*ldx], &ione);
#else
		caxpy_(&nrow, &done, work, &ione,
		       &Xmat[j*ldx], &ione);
#endif
		lstres = berr[j];
		++count;
	    } else {
		break;
	    }
        
	} /* end while */

	stat->RefineSteps = count;

	/* Bound error from formula:
	   norm(X - XTRUE) / norm(X) .le. FERR = norm( abs(inv(op(A)))*   
	   ( abs(R) + NZ*EPS*( abs(op(A))*abs(X)+abs(B) ))) / norm(X)   
          where   
            norm(Z) is the magnitude of the largest component of Z   
            inv(op(A)) is the inverse of op(A)   
            abs(Z) is the componentwise absolute value of the matrix or
	       vector Z   
            NZ is the maximum number of nonzeros in any row of A, plus 1   
            EPS is machine epsilon   

          The i-th component of abs(R)+NZ*EPS*(abs(op(A))*abs(X)+abs(B))   
          is incremented by SAFE1 if the i-th component of   
          abs(op(A))*abs(X) + abs(B) is less than SAFE2.   

          Use CLACON2 to estimate the infinity-norm of the matrix   
             inv(op(A)) * diag(W),   
          where W = abs(R) + NZ*EPS*( abs(op(A))*abs(X)+abs(B) ))) */
	
	for (i = 0; i < A->nrow; ++i) rwork[i] = c_abs1( &Bptr[i] );
	
	/* Compute abs(op(A))*abs(X) + abs(B). */
	if ( notran ) {
	    for (k = 0; k < A->ncol; ++k) {
		xk = c_abs1( &Xptr[k] );
		for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i)
		    rwork[Astore->rowind[i]] += c_abs1(&Aval[i]) * xk;
	    }
	} else {  /* trans == TRANS or CONJ */
	    for (k = 0; k < A->ncol; ++k) {
		s = 0.;
		for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i) {
		    irow = Astore->rowind[i];
		    xk = c_abs1( &Xptr[irow] );
		    s += c_abs1(&Aval[i]) * xk;
		}
		rwork[k] += s;
	    }
	}
	
	for (i = 0; i < A->nrow; ++i)
	    if (rwork[i] > safe2)
		rwork[i] = c_abs(&work[i]) + (iwork[i]+1)*eps*rwork[i];
	    else
		rwork[i] = c_abs(&work[i])+(iwork[i]+1)*eps*rwork[i]+safe1;
	kase = 0;

	do {
	    clacon2_(&nrow, &work[A->nrow], work, &ferr[j], &kase, isave);
	    if (kase == 0) break;

	    if (kase == 1) {
		/* Multiply by diag(W)*inv(op(A)**T)*(diag(C) or diag(R)). */
		if ( notran && colequ )
		    for (i = 0; i < A->ncol; ++i) {
		        cs_mult(&work[i], &work[i], C[i]);
	            }
		else if ( !notran && rowequ )
		    for (i = 0; i < A->nrow; ++i) {
		        cs_mult(&work[i], &work[i], R[i]);
                    }

		cgstrs (transt, L, U, perm_c, perm_r, &Bjcol, stat, info);
		
		for (i = 0; i < A->nrow; ++i) {
		    cs_mult(&work[i], &work[i], rwork[i]);
	 	}
	    } else {
		/* Multiply by (diag(C) or diag(R))*inv(op(A))*diag(W). */
		for (i = 0; i < A->nrow; ++i) {
		    cs_mult(&work[i], &work[i], rwork[i]);
		}
		
		cgstrs (trans, L, U, perm_c, perm_r, &Bjcol, stat, info);
		
		if ( notran && colequ )
		    for (i = 0; i < A->ncol; ++i) {
		        cs_mult(&work[i], &work[i], C[i]);
		    }
		else if ( !notran && rowequ )
		    for (i = 0; i < A->ncol; ++i) {
		        cs_mult(&work[i], &work[i], R[i]);  
		    }
	    }
	    
	} while ( kase != 0 );

	/* Normalize error. */
	lstres = 0.;
 	if ( notran && colequ ) {
	    for (i = 0; i < A->nrow; ++i)
	    	lstres = SUPERLU_MAX( lstres, C[i] * c_abs1( &Xptr[i]) );
  	} else if ( !notran && rowequ ) {
	    for (i = 0; i < A->nrow; ++i)
	    	lstres = SUPERLU_MAX( lstres, R[i] * c_abs1( &Xptr[i]) );
	} else {
	    for (i = 0; i < A->nrow; ++i)
	    	lstres = SUPERLU_MAX( lstres, c_abs1( &Xptr[i]) );
	}
	if ( lstres != 0. )
	    ferr[j] /= lstres;

    } /* for each RHS j ... */
    
    SUPERLU_FREE(work);
    SUPERLU_FREE(rwork);
    SUPERLU_FREE(iwork);
    SUPERLU_FREE(Bjcol.Store);

    return;

}